

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PDA::toVecStr_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PDA *this,vector<char,_std::allocator<char>_> *vecChar)

{
  bool bVar1;
  reference pcVar2;
  string local_68;
  char local_41;
  iterator iStack_40;
  char c;
  iterator __end1;
  iterator __begin1;
  vector<char,_std::allocator<char>_> *__range1;
  vector<char,_std::allocator<char>_> *vecChar_local;
  PDA *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vecStr;
  
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  __end1 = std::vector<char,_std::allocator<char>_>::begin(vecChar);
  iStack_40 = std::vector<char,_std::allocator<char>_>::end(vecChar);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0), bVar1) {
    pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&__end1);
    local_41 = *pcVar2;
    toString_abi_cxx11_(&local_68,local_41);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> PDA::toVecStr(std::vector<char> vecChar) {
    std::vector<std::string> vecStr = {};
    for(char c: vecChar){
        vecStr.emplace_back(toString(c));
    }
    return vecStr;
}